

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Benchmark.cpp
# Opt level: O2

shared_ptr<celero::Experiment> __thiscall celero::Benchmark::getExperiment(Benchmark *this,size_t x)

{
  long lVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<celero::Experiment> sVar2;
  
  lVar1 = *(long *)(*(long *)x + 0x68);
  if (in_RDX._M_pi <
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(*(long *)(*(long *)x + 0x70) - lVar1 >> 4)) {
    std::__shared_ptr<celero::Experiment,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<celero::Experiment,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<celero::Experiment,_(__gnu_cxx::_Lock_policy)2> *)
               (lVar1 + (long)in_RDX._M_pi * 0x10));
    in_RDX._M_pi = extraout_RDX;
  }
  else {
    (this->pimpl)._pimpl._M_t.
    super___uniq_ptr_impl<celero::Benchmark::Impl,_std::default_delete<celero::Benchmark::Impl>_>.
    _M_t.
    super__Tuple_impl<0UL,_celero::Benchmark::Impl_*,_std::default_delete<celero::Benchmark::Impl>_>
    .super__Head_base<0UL,_celero::Benchmark::Impl_*,_false> =
         (_Head_base<0UL,_celero::Benchmark::Impl_*,_false>)0x0;
    this[1].pimpl._pimpl._M_t.
    super___uniq_ptr_impl<celero::Benchmark::Impl,_std::default_delete<celero::Benchmark::Impl>_>.
    _M_t.
    super__Tuple_impl<0UL,_celero::Benchmark::Impl_*,_std::default_delete<celero::Benchmark::Impl>_>
    .super__Head_base<0UL,_celero::Benchmark::Impl_*,_false> =
         (_Head_base<0UL,_celero::Benchmark::Impl_*,_false>)0x0;
  }
  sVar2.super___shared_ptr<celero::Experiment,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  sVar2.super___shared_ptr<celero::Experiment,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<celero::Experiment>)
         sVar2.super___shared_ptr<celero::Experiment,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Experiment> Benchmark::getExperiment(size_t x)
{
	if(x < this->pimpl->experiments.size())
	{
		return this->pimpl->experiments[x];
	}

	return nullptr;
}